

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O3

void __thiscall btGeneric6DofConstraint::calculateAngleInfo(btGeneric6DofConstraint *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  btMatrix3x3 local_38;
  
  fVar9 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[1];
  fVar8 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[2];
  fVar11 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[2];
  fVar16 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[1];
  fVar17 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[0];
  fVar6 = fVar9 * fVar8 - fVar16 * fVar11;
  fVar14 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[0];
  fVar15 = fVar11 * fVar17 - fVar8 * fVar14;
  fVar10 = fVar14 * fVar16 - fVar17 * fVar9;
  fVar4 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[0];
  fVar5 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[1];
  fVar13 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[2];
  fVar18 = 1.0 / (fVar13 * fVar10 + fVar4 * fVar6 + fVar5 * fVar15);
  fVar6 = fVar6 * fVar18;
  fVar3 = (fVar13 * fVar16 - fVar8 * fVar5) * fVar18;
  fVar12 = (fVar5 * fVar11 - fVar9 * fVar13) * fVar18;
  fVar15 = fVar15 * fVar18;
  fVar7 = (fVar4 * fVar8 - fVar17 * fVar13) * fVar18;
  fVar13 = (fVar13 * fVar14 - fVar11 * fVar4) * fVar18;
  fVar10 = fVar10 * fVar18;
  fVar16 = (fVar5 * fVar17 - fVar16 * fVar4) * fVar18;
  fVar18 = (fVar4 * fVar9 - fVar14 * fVar5) * fVar18;
  fVar9 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[2];
  fVar8 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[2];
  fVar11 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[2];
  local_38.m_el[0].m_floats[2] = fVar11 * fVar12 + fVar9 * fVar6 + fVar3 * fVar8;
  local_38.m_el[1].m_floats[2] = fVar11 * fVar13 + fVar9 * fVar15 + fVar7 * fVar8;
  local_38.m_el[2].m_floats[2] = fVar11 * fVar18 + fVar9 * fVar10 + fVar8 * fVar16;
  uVar1 = *(undefined8 *)(this->m_calculatedTransformB).m_basis.m_el[0].m_floats;
  fVar11 = (float)uVar1;
  fVar17 = (float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(this->m_calculatedTransformB).m_basis.m_el[1].m_floats;
  fVar14 = (float)uVar1;
  fVar4 = (float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(this->m_calculatedTransformB).m_basis.m_el[2].m_floats;
  fVar9 = (float)uVar1;
  fVar8 = (float)((ulong)uVar1 >> 0x20);
  local_38.m_el[0].m_floats[1] = fVar12 * fVar8 + fVar6 * fVar17 + fVar3 * fVar4;
  local_38.m_el[0].m_floats[0] = fVar12 * fVar9 + fVar6 * fVar11 + fVar3 * fVar14;
  local_38.m_el[0].m_floats[3] = 0.0;
  local_38.m_el[1].m_floats[1] = fVar13 * fVar8 + fVar15 * fVar17 + fVar7 * fVar4;
  local_38.m_el[1].m_floats[0] = fVar13 * fVar9 + fVar15 * fVar11 + fVar7 * fVar14;
  local_38.m_el[1].m_floats[3] = 0.0;
  local_38.m_el[2].m_floats[1] = fVar18 * fVar8 + fVar10 * fVar17 + fVar16 * fVar4;
  local_38.m_el[2].m_floats[0] = fVar18 * fVar9 + fVar10 * fVar11 + fVar16 * fVar14;
  local_38.m_el[2].m_floats[3] = 0.0;
  matrixToEulerXYZ(&local_38,&this->m_calculatedAxisAngleDiff);
  fVar9 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[0];
  fVar8 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[0];
  fVar11 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[0];
  fVar16 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[2];
  fVar17 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[2];
  fVar14 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[2];
  fVar5 = fVar17 * fVar11 - fVar8 * fVar14;
  fVar13 = fVar9 * fVar14 - fVar16 * fVar11;
  fVar3 = fVar8 * fVar16 - fVar17 * fVar9;
  fVar4 = fVar9 * fVar13 - fVar5 * fVar8;
  fVar8 = fVar8 * fVar3 - fVar11 * fVar13;
  fVar9 = fVar11 * fVar5 - fVar9 * fVar3;
  fVar11 = 1.0 / SQRT(fVar4 * fVar4 + fVar8 * fVar8 + fVar9 * fVar9);
  this->m_calculatedAxis[1].m_floats[2] = fVar3;
  this->m_calculatedAxis[1].m_floats[3] = 0.0;
  this->m_calculatedAxis[2].m_floats[0] = fVar11 * fVar8;
  this->m_calculatedAxis[2].m_floats[1] = fVar11 * fVar9;
  fVar8 = fVar14 * fVar13 - fVar17 * fVar3;
  fVar14 = fVar16 * fVar3 - fVar14 * fVar5;
  fVar9 = fVar5 * fVar17 - fVar16 * fVar13;
  *(ulong *)(this->m_calculatedAxis[2].m_floats + 2) = (ulong)(uint)fVar4;
  fVar16 = 1.0 / SQRT(fVar9 * fVar9 + fVar8 * fVar8 + fVar14 * fVar14);
  auVar2._4_4_ = fVar16 * fVar14;
  auVar2._0_4_ = fVar16 * fVar8;
  auVar2._8_4_ = fVar9;
  auVar2._12_4_ = 0;
  *(undefined1 (*) [16])this->m_calculatedAxis[0].m_floats = auVar2;
  this->m_calculatedAxis[0].m_floats[2] = fVar9 * fVar16;
  fVar9 = 1.0 / SQRT(fVar3 * fVar3 + fVar5 * fVar5 + fVar13 * fVar13);
  this->m_calculatedAxis[1].m_floats[0] = fVar5 * fVar9;
  *(ulong *)(this->m_calculatedAxis[1].m_floats + 1) = CONCAT44(fVar9 * fVar3,fVar9 * fVar13);
  this->m_calculatedAxis[2].m_floats[2] = fVar11 * fVar4;
  return;
}

Assistant:

void btGeneric6DofConstraint::calculateAngleInfo()
{
	btMatrix3x3 relative_frame = m_calculatedTransformA.getBasis().inverse()*m_calculatedTransformB.getBasis();
	matrixToEulerXYZ(relative_frame,m_calculatedAxisAngleDiff);
	// in euler angle mode we do not actually constrain the angular velocity
	// along the axes axis[0] and axis[2] (although we do use axis[1]) :
	//
	//    to get			constrain w2-w1 along		...not
	//    ------			---------------------		------
	//    d(angle[0])/dt = 0	ax[1] x ax[2]			ax[0]
	//    d(angle[1])/dt = 0	ax[1]
	//    d(angle[2])/dt = 0	ax[0] x ax[1]			ax[2]
	//
	// constraining w2-w1 along an axis 'a' means that a'*(w2-w1)=0.
	// to prove the result for angle[0], write the expression for angle[0] from
	// GetInfo1 then take the derivative. to prove this for angle[2] it is
	// easier to take the euler rate expression for d(angle[2])/dt with respect
	// to the components of w and set that to 0.
	btVector3 axis0 = m_calculatedTransformB.getBasis().getColumn(0);
	btVector3 axis2 = m_calculatedTransformA.getBasis().getColumn(2);

	m_calculatedAxis[1] = axis2.cross(axis0);
	m_calculatedAxis[0] = m_calculatedAxis[1].cross(axis2);
	m_calculatedAxis[2] = axis0.cross(m_calculatedAxis[1]);

	m_calculatedAxis[0].normalize();
	m_calculatedAxis[1].normalize();
	m_calculatedAxis[2].normalize();

}